

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MipsParser.cpp
# Opt level: O0

unique_ptr<CAssemblerCommand,_std::default_delete<CAssemblerCommand>_> __thiscall
MipsParser::parseMacro(MipsParser *this,Parser *parser)

{
  bool bVar1;
  Tokenizer *this_00;
  Token *pTVar2;
  Identifier *this_01;
  TokenizerPosition pos;
  MipsRegisterData *in_RDX;
  TokenizerPosition tokenPos;
  int local_b4;
  int z;
  Identifier *identifier;
  undefined1 local_90 [8];
  Token token;
  TokenizerPosition startPos;
  Tokenizer *tokenizer;
  Parser *parser_local;
  MipsParser *this_local;
  
  this_00 = Parser::getTokenizer((Parser *)in_RDX);
  token.originalText.field_2._8_8_ = Tokenizer::getPosition(this_00);
  pTVar2 = Parser::peekToken((Parser *)in_RDX,0);
  Token::Token((Token *)local_90,pTVar2);
  if ((int)token.column == 1) {
    Parser::eatToken((Parser *)in_RDX);
    this_01 = Token::identifierValue((Token *)local_90);
    local_b4 = 0;
    while (mipsMacros[local_b4].name != (char *)0x0) {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)&tokenPos,
                 mipsMacros[local_b4].name);
      bVar1 = Identifier::operator==(this_01,_tokenPos);
      if (bVar1) {
        pos = Tokenizer::getPosition(this_00);
        bVar1 = parseMacroParameters((MipsParser *)parser,(Parser *)in_RDX,mipsMacros + local_b4);
        if (bVar1) {
          (*mipsMacros[local_b4].function)
                    ((Parser *)this,in_RDX,(MipsImmediateData *)parser,
                     (int)&parser[4].conditionStack + 8);
          goto LAB_001d1caa;
        }
        Tokenizer::setPosition(this_00,pos);
      }
      local_b4 = local_b4 + 1;
    }
    Tokenizer::setPosition(this_00,(TokenizerPosition)token.originalText.field_2._8_8_);
    std::unique_ptr<CAssemblerCommand,std::default_delete<CAssemblerCommand>>::
    unique_ptr<std::default_delete<CAssemblerCommand>,void>
              ((unique_ptr<CAssemblerCommand,std::default_delete<CAssemblerCommand>> *)this,
               (nullptr_t)0x0);
  }
  else {
    std::unique_ptr<CAssemblerCommand,std::default_delete<CAssemblerCommand>>::
    unique_ptr<std::default_delete<CAssemblerCommand>,void>
              ((unique_ptr<CAssemblerCommand,std::default_delete<CAssemblerCommand>> *)this,
               (nullptr_t)0x0);
  }
LAB_001d1caa:
  Token::~Token((Token *)local_90);
  return (__uniq_ptr_data<CAssemblerCommand,_std::default_delete<CAssemblerCommand>,_true,_true>)
         (__uniq_ptr_data<CAssemblerCommand,_std::default_delete<CAssemblerCommand>,_true,_true>)
         this;
}

Assistant:

std::unique_ptr<CAssemblerCommand> MipsParser::parseMacro(Parser& parser)
{
	Tokenizer* tokenizer = parser.getTokenizer();
	TokenizerPosition startPos = tokenizer->getPosition();

	// Cannot be a reference (we eat below.)
	const Token token = parser.peekToken();
	if (token.type != TokenType::Identifier)
		return nullptr;
	
	parser.eatToken();
	const Identifier &identifier = token.identifierValue();
	for (int z = 0; mipsMacros[z].name != nullptr; z++)
	{
		if (identifier == mipsMacros[z].name)
		{
			TokenizerPosition tokenPos = tokenizer->getPosition();

			if (parseMacroParameters(parser,mipsMacros[z]))
			{
				return mipsMacros[z].function(parser,registers,immediate,mipsMacros[z].flags);
			}

			tokenizer->setPosition(tokenPos);
		}
	}

	// no matching macro found, restore state
	tokenizer->setPosition(startPos);
	return nullptr;
}